

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_duckdb_result_type_&,_const_duckdb_result_type_&> * __thiscall
Catch::ExprLhs<duckdb_result_type_const&>::operator==
          (BinaryExpr<const_duckdb_result_type_&,_const_duckdb_result_type_&>
           *__return_storage_ptr__,ExprLhs<duckdb_result_type_const&> *this,duckdb_result_type *rhs)

{
  duckdb_result_type dVar1;
  duckdb_result_type dVar2;
  duckdb_result_type *pdVar3;
  StringRef local_40;
  
  pdVar3 = *(duckdb_result_type **)this;
  dVar1 = *pdVar3;
  dVar2 = *rhs;
  StringRef::StringRef(&local_40,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = dVar1 == dVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_005714f0;
  __return_storage_ptr__->m_lhs = pdVar3;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }